

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::formattedDataSize
          (QString *__return_storage_ptr__,QLocale *this,qint64 bytes,int precision,
          DataSizeFormats format)

{
  QLocalePrivate *pQVar1;
  QLocaleData *pQVar2;
  long lVar3;
  double dVar4;
  ulong uVar5;
  DataRange DVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  double dVar9;
  QStringView local_78;
  QString local_68;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QStringView_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar9 = 1000.0;
  if (bytes == 0) {
    iVar7 = 0;
  }
  else {
    uVar5 = -bytes;
    if (0 < bytes) {
      uVar5 = bytes;
    }
    if (((uint)format.super_QFlagsStorageHelper<QLocale::DataSizeFormat,_4>.
               super_QFlagsStorage<QLocale::DataSizeFormat>.i & 1) == 0) {
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      iVar7 = (int)((ulong)((uint)lVar3 ^ 1) * 0x1999999a >> 0x20);
      dVar9 = 1024.0;
    }
    else {
      auVar8._8_4_ = (int)(uVar5 >> 0x20);
      auVar8._0_8_ = uVar5;
      auVar8._12_4_ = 0x45300000;
      dVar4 = log10((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
      dVar9 = 1000.0;
      iVar7 = (int)dVar4 / 3;
    }
  }
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (iVar7 == 0) {
    pQVar1 = (this->d).d.ptr;
    QLocaleData::longLongToString
              (&local_68,pQVar1->m_data,bytes,-1,10,-1,
               (~(pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                 super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5);
  }
  else {
    dVar9 = pow(dVar9,(double)iVar7);
    if (iVar7 * 3 < precision) {
      precision = iVar7 * 3;
    }
    toString(&local_68,this,(double)bytes / dVar9,'f',precision);
  }
  local_78.m_size = 0;
  local_78.m_data = (storage_type_conflict *)0x0;
  if (iVar7 < 1) {
    pQVar2 = ((this->d).d.ptr)->m_data;
    uVar5 = (ulong)pQVar2->m_byteCount_idx;
    local_78.m_size = (qsizetype)pQVar2->m_byteCount_size;
  }
  else {
    uVar5 = (ulong)(((uint)format.super_QFlagsStorageHelper<QLocale::DataSizeFormat,_4>.
                           super_QFlagsStorage<QLocale::DataSizeFormat>.i & 2) == 0);
    pQVar2 = ((this->d).d.ptr)->m_data;
    local_50.a.a = (QString *)
                   ((ulong)(byte)pQVar2->m_currency_iso_code[uVar5 - 8] << 0x20 |
                   (ulong)*(ushort *)(pQVar2->m_currency_iso_code + uVar5 * 2 + -0x35));
    DVar6 = QLocaleData::DataRange::listEntry
                      ((DataRange *)&local_50,
                       L"byteskB;MB;GB;TB;PB;EBKiB;MiB;GiB;TiB;PiB;EiBgreepbajtባይትኪባ;ሜጋባይት;ጊባ;ቴራባይት;ፔባ;EBبايتكيلوبايت;م.ب;غ.ب;تيرابايت;بيتابايت;EBբայթկԲ;ՄԲ;ԳԲ;ՏԲ;ՊԲ;EBবাইটকিঃ বাঃ;মেঃ বাঃ;গিঃ বাঃ;টেঃ বাঃ;PB;EBbaytbyte-akбайтыКБ;МБ;ГБ;ТБ;ПБ;EBbajtovioktedoùko;Mo;Go;To;Po;EoKio;Mio;Gio;Tio;Pio;Eioбайтовеဘိုက်mga byte𑄝𑄭𑄖𑄴ᏗᏓᏍᎦᎵᎩ字节位元組Кбайт;Мбайт;Гбайт;Тбайт;Пбайт;EBbajtyबाइटbajtojbaididbýttavutkt;Mt;Gt;Tt;Pt;EtKit;Mit;Git;Tit;Pit;Eitoctets𞤶𞤫𞥅𞤼𞥆𞤭𞤳𞤔;𞤃𞤔;𞤘𞤔;𞤚𞤔;𞤆𞤔;EBbaidhtბაიტიკბაიტი;MB;GB;ტბაიტი;პბაიტი;EBBytesબાઇટkB {0};MB {0};GB {0};TB {0};PB {0};EB {0}KiB {0};MiB {0};GiB {0};TiB {0};PiB {0};EiB {0}בייטbájtbætioctetesbeartaバイトKB;MB;GB;TB;PB;EBbiteaṭamḍankAṬ;MAṬ;GAṬ;TAṬ;PB;EBಬೈಟ್\x200cಗಳುಕಿ.ಬೈ.;ಮೆ.ಬೈ.;ಗಿ.ಬೈ.;ಟೆ.ಬೈ.;ಪೆಬೈ;EBкБ;MБ;ГБ;TБ;ПБ;EБKiБ;MiБ;GiБ;TiБ;PiБ;EiБបៃबायट바이트кБ;МБ;ГБ;ТБ;Птб;EBbaitibaitaiбајтиബൈറ്റ്കെബി;എംബി;ജിബി;ടിബി;പിബി;EBبایتکیلوبایت;مگابایت;گیگابایت;ترابایت;PB;EBкБ;МБ;ГБ;ТБ;ПБ;EBkB;MB;GB;TB;पिटा;EBBait-dẹmବାଇଟ୍بايټسਬਾਇਟbyțiбаайткБ;МБ;GB;TB;PB;EBбајтовиبائيٽزڪلو بائيٽز;MB;GB;TB;PB;EBබයිට්කිබ {0};මෙබ {0};ගිබ {0};ටෙබ {0};පෙබ {0};EBbeytiskB;MB;GB;TB;BB;EBkilobaiti {0};MB {0};GB {0};terabaiti {0};PB {0};EBܒܐܝܬபைட்கள்బైట్\x200cలుకేబీ;ఎమ్\x200cబి;జీబీ;టీబీ;పీబీ;EBไบต์ኪሎባይት;ሜጋባይት;ጊጋባይት;ቴራባይት;ፔታባይት;EBpaitikB ʻe {0};MB ʻe {0};GB ʻe {0};TB ʻe {0};PB ʻe {0};EB ʻe {0}KiB ʻe {0};MiB ʻe {0};GiB ʻe {0};TiB ʻe {0};PiB ʻe {0};EiB ʻe {0}baýtбайтиbyteyبائٹkB;MB;GB;TB;پی بی;EBbeitiauàwọ́n báìtìkébáìtì;MB;jíbáìtì;Tíbáìtì;Píbáìtì;EBàwɔ́n báìtìbyte agbyte-ita"
                       ,(ulong)(iVar7 - 1));
    uVar5 = (ulong)DVar6 & 0xffffffff;
    local_78.m_size = (ulong)DVar6 >> 0x20;
  }
  local_78.m_data =
       L"byteskB;MB;GB;TB;PB;EBKiB;MiB;GiB;TiB;PiB;EiBgreepbajtባይትኪባ;ሜጋባይት;ጊባ;ቴራባይት;ፔባ;EBبايتكيلوبايت;م.ب;غ.ب;تيرابايت;بيتابايت;EBբայթկԲ;ՄԲ;ԳԲ;ՏԲ;ՊԲ;EBবাইটকিঃ বাঃ;মেঃ বাঃ;গিঃ বাঃ;টেঃ বাঃ;PB;EBbaytbyte-akбайтыКБ;МБ;ГБ;ТБ;ПБ;EBbajtovioktedoùko;Mo;Go;To;Po;EoKio;Mio;Gio;Tio;Pio;Eioбайтовеဘိုက်mga byte𑄝𑄭𑄖𑄴ᏗᏓᏍᎦᎵᎩ字节位元組Кбайт;Мбайт;Гбайт;Тбайт;Пбайт;EBbajtyबाइटbajtojbaididbýttavutkt;Mt;Gt;Tt;Pt;EtKit;Mit;Git;Tit;Pit;Eitoctets𞤶𞤫𞥅𞤼𞥆𞤭𞤳𞤔;𞤃𞤔;𞤘𞤔;𞤚𞤔;𞤆𞤔;EBbaidhtბაიტიკბაიტი;MB;GB;ტბაიტი;პბაიტი;EBBytesબાઇટkB {0};MB {0};GB {0};TB {0};PB {0};EB {0}KiB {0};MiB {0};GiB {0};TiB {0};PiB {0};EiB {0}בייטbájtbætioctetesbeartaバイトKB;MB;GB;TB;PB;EBbiteaṭamḍankAṬ;MAṬ;GAṬ;TAṬ;PB;EBಬೈಟ್\x200cಗಳುಕಿ.ಬೈ.;ಮೆ.ಬೈ.;ಗಿ.ಬೈ.;ಟೆ.ಬೈ.;ಪೆಬೈ;EBкБ;MБ;ГБ;TБ;ПБ;EБKiБ;MiБ;GiБ;TiБ;PiБ;EiБបៃबायट바이트кБ;МБ;ГБ;ТБ;Птб;EBbaitibaitaiбајтиബൈറ്റ്കെബി;എംബി;ജിബി;ടിബി;പിബി;EBبایتکیلوبایت;مگابایت;گیگابایت;ترابایت;PB;EBкБ;МБ;ГБ;ТБ;ПБ;EBkB;MB;GB;TB;पिटा;EBBait-dẹmବାଇଟ୍بايټسਬਾਇਟbyțiбаайткБ;МБ;GB;TB;PB;EBбајтовиبائيٽزڪلو بائيٽز;MB;GB;TB;PB;EBබයිට්කිබ {0};මෙබ {0};ගිබ {0};ටෙබ {0};පෙබ {0};EBbeytiskB;MB;GB;TB;BB;EBkilobaiti {0};MB {0};GB {0};terabaiti {0};PB {0};EBܒܐܝܬபைட்கள்బైట్\x200cలుకేబీ;ఎమ్\x200cబి;జీబీ;టీబీ;పీబీ;EBไบต์ኪሎባይት;ሜጋባይት;ጊጋባይት;ቴራባይት;ፔታባይት;EBpaitikB ʻe {0};MB ʻe {0};GB ʻe {0};TB ʻe {0};PB ʻe {0};EB ʻe {0}KiB ʻe {0};MiB ʻe {0};GiB ʻe {0};TiB ʻe {0};PiB ʻe {0};EiB ʻe {0}baýtбайтиbyteyبائٹkB;MB;GB;TB;پی بی;EBbeitiauàwọ́n báìtìkébáìtì;MB;jíbáìtì;Tíbáìtì;Píbáìtì;EBàwɔ́n báìtìbyte agbyte-ita"
       + uVar5;
  local_50.a.a = &local_68;
  local_50.a.b = L' ';
  local_50.b = &local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QStringView_&>::convertTo<QString>
            (__return_storage_ptr__,&local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::formattedDataSize(qint64 bytes, int precision, DataSizeFormats format) const
{
    int power, base = 1000;
    if (!bytes) {
        power = 0;
    } else if (format & DataSizeBase1000) {
        constexpr auto log10_1000 = 3; // std::log10(1000U)
        power = int(std::log10(QtPrivate::qUnsignedAbs(bytes))) / log10_1000;
    } else {
        constexpr auto log2_1024 = 10; // QtPrivate::log2i(1024U);
        power = QtPrivate::log2i(QtPrivate::qUnsignedAbs(bytes)) / log2_1024;
        base = 1024;
    }
    // Only go to doubles if we'll be using a quantifier:
    const QString number = power
        ? toString(bytes / std::pow(double(base), power), 'f', qMin(precision, 3 * power))
        : toString(bytes);

    // We don't support sizes in units larger than exbibytes because
    // the number of bytes would not fit into qint64.
    Q_ASSERT(power <= 6 && power >= 0);
    QStringView unit;
    if (power > 0) {
        QLocaleData::DataRange range = (format & DataSizeSIQuantifiers)
            ? d->m_data->byteAmountSI() : d->m_data->byteAmountIEC();
        unit = range.viewListEntry(byte_unit_data, power - 1);
    } else {
        unit = d->m_data->byteCount().viewData(byte_unit_data);
    }

    return number + u' ' + unit;
}